

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O1

void ImGui_ImplGlfw_KeyCallback(GLFWwindow *window,int keycode,int scancode,int action,int mods)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  ImGuiContext *pIVar4;
  ImGuiIO *pIVar5;
  GLFWerrorfun cbfun;
  char *pcVar6;
  long *plVar7;
  int __c;
  ImGuiKey key;
  uint mods_00;
  char local_38 [16];
  
  pIVar4 = ImGui::GetCurrentContext();
  if (pIVar4 == (ImGuiContext *)0x0) {
    plVar7 = (long *)0x0;
  }
  else {
    pIVar5 = ImGui::GetIO();
    plVar7 = (long *)pIVar5->BackendPlatformUserData;
  }
  if (((code *)plVar7[0x14] != (code *)0x0) && ((GLFWwindow *)*plVar7 == window)) {
    (*(code *)plVar7[0x14])(window,keycode,scancode,action,mods);
  }
  if (1 < (uint)action) {
    return;
  }
  uVar3 = 0;
  switch(keycode) {
  case 0x154:
  case 0x158:
    uVar3 = 1;
    break;
  case 0x155:
  case 0x159:
    uVar3 = 2;
    break;
  case 0x156:
  case 0x15a:
    uVar3 = 4;
    break;
  case 0x157:
  case 0x15b:
    uVar3 = 8;
    break;
  default:
    bVar2 = true;
    goto LAB_0023b0d1;
  }
  bVar2 = false;
LAB_0023b0d1:
  mods_00 = mods;
  if (!bVar2) {
    mods_00 = ~uVar3 & mods;
    if (action == 1) {
      mods_00 = uVar3 | mods;
    }
  }
  ImGui_ImplGlfw_UpdateKeyModifiers(mods_00);
  __c = keycode;
  if (0x10 < keycode - 0x140U) {
    cbfun = glfwSetErrorCallback((GLFWerrorfun)0x0);
    pcVar6 = glfwGetKeyName(keycode,scancode);
    glfwSetErrorCallback(cbfun);
    glfwGetError((char **)0x0);
    if (((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) && (pcVar6[1] == '\0')) {
      builtin_strncpy(local_38,"`-=[]\\,;\'./",0xc);
      cVar1 = *pcVar6;
      __c = (int)cVar1;
      if (0x19 < (byte)(cVar1 + 0xbfU) && 9 < (byte)(cVar1 - 0x30U)) {
        if ((byte)(cVar1 + 0x9fU) < 0x1a) {
          __c = __c + -0x20;
        }
        else {
          pcVar6 = strchr(local_38,__c);
          __c = keycode;
          if (pcVar6 != (char *)0x0) {
            __c = *(int *)(&DAT_00267180 + ((long)pcVar6 - (long)local_38) * 4);
          }
        }
      }
    }
  }
  pIVar5 = ImGui::GetIO();
  switch(__c) {
  case 0x100:
    key = ImGuiKey_Escape;
    break;
  case 0x101:
    key = ImGuiKey_Enter;
    break;
  case 0x102:
    key = ImGuiKey_NamedKey_BEGIN;
    break;
  case 0x103:
    key = ImGuiKey_Backspace;
    break;
  case 0x104:
    key = ImGuiKey_Insert;
    break;
  case 0x105:
    key = ImGuiKey_Delete;
    break;
  case 0x106:
    key = ImGuiKey_RightArrow;
    break;
  case 0x107:
    key = ImGuiKey_LeftArrow;
    break;
  case 0x108:
    key = ImGuiKey_DownArrow;
    break;
  case 0x109:
    key = ImGuiKey_UpArrow;
    break;
  case 0x10a:
    key = ImGuiKey_PageUp;
    break;
  case 0x10b:
    key = ImGuiKey_PageDown;
    break;
  case 0x10c:
    key = ImGuiKey_Home;
    break;
  case 0x10d:
    key = ImGuiKey_End;
    break;
  case 0x10e:
  case 0x10f:
  case 0x110:
  case 0x111:
  case 0x112:
  case 0x113:
  case 0x114:
  case 0x115:
  case 0x116:
  case 0x117:
  case 0x11d:
  case 0x11e:
  case 0x11f:
  case 0x120:
  case 0x121:
  case 0x12e:
  case 0x12f:
  case 0x130:
  case 0x131:
  case 0x132:
  case 0x133:
  case 0x134:
  case 0x135:
  case 0x136:
  case 0x137:
  case 0x138:
  case 0x139:
  case 0x13a:
  case 0x13b:
  case 0x13c:
  case 0x13d:
  case 0x13e:
  case 0x13f:
  case 0x151:
  case 0x152:
  case 0x153:
switchD_0023b192_caseD_10e:
    key = ImGuiKey_KeysData_OFFSET;
    break;
  case 0x118:
    key = ImGuiKey_CapsLock;
    break;
  case 0x119:
    key = ImGuiKey_ScrollLock;
    break;
  case 0x11a:
    key = ImGuiKey_NumLock;
    break;
  case 0x11b:
    key = ImGuiKey_PrintScreen;
    break;
  case 0x11c:
    key = ImGuiKey_Pause;
    break;
  case 0x122:
    key = ImGuiKey_F1;
    break;
  case 0x123:
    key = ImGuiKey_F2;
    break;
  case 0x124:
    key = ImGuiKey_F3;
    break;
  case 0x125:
    key = ImGuiKey_F4;
    break;
  case 0x126:
    key = ImGuiKey_F5;
    break;
  case 0x127:
    key = ImGuiKey_F6;
    break;
  case 0x128:
    key = ImGuiKey_F7;
    break;
  case 0x129:
    key = ImGuiKey_F8;
    break;
  case 0x12a:
    key = ImGuiKey_F9;
    break;
  case 299:
    key = ImGuiKey_F10;
    break;
  case 300:
    key = ImGuiKey_F11;
    break;
  case 0x12d:
    key = ImGuiKey_F12;
    break;
  case 0x140:
    key = ImGuiKey_Keypad0;
    break;
  case 0x141:
    key = ImGuiKey_Keypad1;
    break;
  case 0x142:
    key = ImGuiKey_Keypad2;
    break;
  case 0x143:
    key = ImGuiKey_Keypad3;
    break;
  case 0x144:
    key = ImGuiKey_Keypad4;
    break;
  case 0x145:
    key = ImGuiKey_Keypad5;
    break;
  case 0x146:
    key = ImGuiKey_Keypad6;
    break;
  case 0x147:
    key = ImGuiKey_Keypad7;
    break;
  case 0x148:
    key = ImGuiKey_Keypad8;
    break;
  case 0x149:
    key = ImGuiKey_Keypad9;
    break;
  case 0x14a:
    key = ImGuiKey_KeypadDecimal;
    break;
  case 0x14b:
    key = ImGuiKey_KeypadDivide;
    break;
  case 0x14c:
    key = ImGuiKey_KeypadMultiply;
    break;
  case 0x14d:
    key = ImGuiKey_KeypadSubtract;
    break;
  case 0x14e:
    key = ImGuiKey_KeypadAdd;
    break;
  case 0x14f:
    key = ImGuiKey_KeyPadEnter;
    break;
  case 0x150:
    key = ImGuiKey_KeypadEqual;
    break;
  case 0x154:
    key = ImGuiKey_LeftShift;
    break;
  case 0x155:
    key = ImGuiKey_LeftCtrl;
    break;
  case 0x156:
    key = ImGuiKey_LeftAlt;
    break;
  case 0x157:
    key = ImGuiKey_LeftSuper;
    break;
  case 0x158:
    key = ImGuiKey_RightShift;
    break;
  case 0x159:
    key = ImGuiKey_RightCtrl;
    break;
  case 0x15a:
    key = ImGuiKey_RightAlt;
    break;
  case 0x15b:
    key = ImGuiKey_RightSuper;
    break;
  case 0x15c:
    key = ImGuiKey_Menu;
    break;
  default:
    switch(__c) {
    case 0x20:
      key = ImGuiKey_Space;
      break;
    default:
      goto switchD_0023b192_caseD_10e;
    case 0x27:
      key = ImGuiKey_Apostrophe;
      break;
    case 0x2c:
      key = ImGuiKey_Comma;
      break;
    case 0x2d:
      key = ImGuiKey_Minus;
      break;
    case 0x2e:
      key = ImGuiKey_Period;
      break;
    case 0x2f:
      key = ImGuiKey_Slash;
      break;
    case 0x30:
      key = ImGuiKey_0;
      break;
    case 0x31:
      key = ImGuiKey_1;
      break;
    case 0x32:
      key = ImGuiKey_2;
      break;
    case 0x33:
      key = ImGuiKey_3;
      break;
    case 0x34:
      key = ImGuiKey_4;
      break;
    case 0x35:
      key = ImGuiKey_5;
      break;
    case 0x36:
      key = ImGuiKey_6;
      break;
    case 0x37:
      key = ImGuiKey_7;
      break;
    case 0x38:
      key = ImGuiKey_8;
      break;
    case 0x39:
      key = ImGuiKey_9;
      break;
    case 0x3b:
      key = ImGuiKey_Semicolon;
      break;
    case 0x3d:
      key = ImGuiKey_Equal;
      break;
    case 0x41:
      key = ImGuiKey_A;
      break;
    case 0x42:
      key = ImGuiKey_B;
      break;
    case 0x43:
      key = ImGuiKey_C;
      break;
    case 0x44:
      key = ImGuiKey_D;
      break;
    case 0x45:
      key = ImGuiKey_E;
      break;
    case 0x46:
      key = ImGuiKey_F;
      break;
    case 0x47:
      key = ImGuiKey_G;
      break;
    case 0x48:
      key = ImGuiKey_H;
      break;
    case 0x49:
      key = ImGuiKey_I;
      break;
    case 0x4a:
      key = ImGuiKey_J;
      break;
    case 0x4b:
      key = ImGuiKey_K;
      break;
    case 0x4c:
      key = ImGuiKey_L;
      break;
    case 0x4d:
      key = ImGuiKey_M;
      break;
    case 0x4e:
      key = ImGuiKey_N;
      break;
    case 0x4f:
      key = ImGuiKey_O;
      break;
    case 0x50:
      key = ImGuiKey_P;
      break;
    case 0x51:
      key = ImGuiKey_Q;
      break;
    case 0x52:
      key = ImGuiKey_R;
      break;
    case 0x53:
      key = ImGuiKey_S;
      break;
    case 0x54:
      key = ImGuiKey_T;
      break;
    case 0x55:
      key = ImGuiKey_U;
      break;
    case 0x56:
      key = ImGuiKey_V;
      break;
    case 0x57:
      key = ImGuiKey_W;
      break;
    case 0x58:
      key = ImGuiKey_X;
      break;
    case 0x59:
      key = ImGuiKey_Y;
      break;
    case 0x5a:
      key = ImGuiKey_Z;
      break;
    case 0x5b:
      key = ImGuiKey_LeftBracket;
      break;
    case 0x5c:
      key = ImGuiKey_Backslash;
      break;
    case 0x5d:
      key = ImGuiKey_RightBracket;
      break;
    case 0x60:
      key = ImGuiKey_GraveAccent;
    }
  }
  ImGuiIO::AddKeyEvent(pIVar5,key,action == 1);
  ImGuiIO::SetKeyEventNativeData(pIVar5,key,__c,scancode,-1);
  return;
}

Assistant:

void ImGui_ImplGlfw_KeyCallback(GLFWwindow* window, int keycode, int scancode, int action, int mods)
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    if (bd->PrevUserCallbackKey != nullptr && window == bd->Window)
        bd->PrevUserCallbackKey(window, keycode, scancode, action, mods);

    if (action != GLFW_PRESS && action != GLFW_RELEASE)
        return;

    // Workaround: X11 does not include current pressed/released modifier key in 'mods' flags. https://github.com/glfw/glfw/issues/1630
    if (int keycode_to_mod = ImGui_ImplGlfw_KeyToModifier(keycode))
        mods = (action == GLFW_PRESS) ? (mods | keycode_to_mod) : (mods & ~keycode_to_mod);
    ImGui_ImplGlfw_UpdateKeyModifiers(mods);

    keycode = ImGui_ImplGlfw_TranslateUntranslatedKey(keycode, scancode);

    ImGuiIO& io = ImGui::GetIO();
    ImGuiKey imgui_key = ImGui_ImplGlfw_KeyToImGuiKey(keycode);
    io.AddKeyEvent(imgui_key, (action == GLFW_PRESS));
    io.SetKeyEventNativeData(imgui_key, keycode, scancode); // To support legacy indexing (<1.87 user code)
}